

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::dereference_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  CompilerGLSL *this_00;
  string local_30;
  
  this_00 = (CompilerGLSL *)(expr->_M_dataplus)._M_p;
  if (*(char *)&(this_00->super_Compiler)._vptr_Compiler == '&') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)expr);
  }
  else if ((this->backend).native_pointers == true) {
    local_30._M_dataplus._M_p._0_1_ = 0x2a;
    join<char,std::__cxx11::string_const&>
              (__return_storage_ptr__,(spirv_cross *)&local_30,(char *)expr,expr);
  }
  else if (((expr_type->storage == StorageClassPhysicalStorageBuffer) &&
           (*(int *)&(expr_type->super_IVariant).field_0xc != 0xf)) &&
          (expr_type->pointer_depth == 1)) {
    enclose_expression(&local_30,this_00,expr);
    join<std::__cxx11::string,char_const(&)[7]>
              (__return_storage_ptr__,(spirv_cross *)&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".value",
               (char (*) [7])expr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,this_00,
               (long)(this_00->super_Compiler).ir.ids.stack_storage.aligned_char +
               expr->_M_string_length + 0xffffffffffffffc0);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (expr_type.storage == StorageClassPhysicalStorageBufferEXT && expr_type.basetype != SPIRType::Struct &&
	         expr_type.pointer_depth == 1)
	{
		return join(enclose_expression(expr), ".value");
	}
	else
		return expr;
}